

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *psVar3;
  int i;
  long lVar4;
  int mask;
  uint uVar5;
  long in_FS_OFFSET;
  
  uVar5 = 0x80;
  lVar4 = 0;
  do {
    if ((uVar5 & channel) != 0) {
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011d1df:
        if (s->img_buffer_end <= s->img_buffer) {
LAB_0011d238:
          *(char **)(in_FS_OFFSET + -0x20) = "bad file";
          return (stbi_uc *)0x0;
        }
      }
      else {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 != 0) {
          if (s->read_from_callbacks == 0) goto LAB_0011d238;
          goto LAB_0011d1df;
        }
      }
      psVar3 = s->img_buffer;
      if (psVar3 < s->img_buffer_end) {
LAB_0011d215:
        s->img_buffer = psVar3 + 1;
        sVar1 = *psVar3;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar3 = s->img_buffer;
          goto LAB_0011d215;
        }
        sVar1 = '\0';
      }
      dest[lVar4] = sVar1;
    }
    lVar4 = lVar4 + 1;
    uVar5 = uVar5 >> 1;
    if (lVar4 == 4) {
      return dest;
    }
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}